

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

TestResult * test_one<short>(random_numerators<short> *vals,short denom)

{
  short sVar1;
  uint32_t uVar2;
  unsigned_long *puVar3;
  byte bVar4;
  ushort in_DX;
  random_numerators<short> *in_RSI;
  TestResult *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  timer t;
  uint64_t expected;
  size_t iter;
  time_double tresult;
  uint64_t min_gen_time;
  uint64_t min_his_time;
  uint64_t min_my_time_vector_branchfree;
  uint64_t min_my_time_vector;
  uint64_t min_my_time_branchfree;
  uint64_t min_my_time;
  divider<short,_(libdivide::Branching)1> div_bfree;
  divider<short,_(libdivide::Branching)0> div_bfull;
  bool testBranchfree;
  int16_t magic;
  uint16_t twice_rem;
  uint16_t e;
  uint16_t proposed_m;
  uint16_t rem;
  uint8_t more;
  uint16_t floor_log_2_d;
  uint16_t absD;
  uint16_t ud;
  libdivide_s16_t result;
  uint16_t result_1;
  uint32_t n;
  libdivide_s16_t tmp;
  libdivide_s16_branchfree_t result_2;
  int16_t magic_1;
  uint16_t twice_rem_1;
  uint16_t e_1;
  uint16_t proposed_m_1;
  uint16_t rem_1;
  uint8_t more_1;
  uint16_t floor_log_2_d_1;
  uint16_t absD_1;
  uint16_t ud_1;
  libdivide_s16_t result_3;
  uint16_t result_4;
  uint32_t n_1;
  uint64_t in_stack_fffffffffffffdb8;
  uint64_t in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  random_numerators<short> *in_stack_fffffffffffffdd0;
  pFuncToTime<short,_libdivide::divider<short,_(libdivide::Branching)1>_> in_stack_fffffffffffffde0;
  random_numerators<short> *in_stack_fffffffffffffde8;
  random_numerators<short> *in_stack_fffffffffffffdf0;
  uint64_t local_1d0;
  timer local_1c8;
  short local_1a8;
  byte local_1a6;
  short local_1a4;
  byte local_1a2;
  time_double local_1a0;
  short local_190;
  byte local_18e;
  short local_18c;
  byte local_18a;
  time_double local_188;
  short local_178;
  byte local_176;
  short local_174;
  byte local_172;
  time_double local_170;
  short local_160;
  byte local_15e;
  short local_15c;
  byte local_15a;
  time_double local_158;
  uint64_t local_148;
  time_double local_140;
  ulong local_130;
  time_double local_128;
  unsigned_long local_118;
  unsigned_long local_110;
  unsigned_long local_108;
  unsigned_long local_100;
  unsigned_long local_f8;
  unsigned_long local_f0;
  short local_e1;
  byte local_df;
  short local_de;
  byte local_dc;
  byte local_db;
  random_numerators<short> *local_d8;
  short *local_c8;
  ushort local_ba;
  short *local_b8;
  short *local_a8;
  short local_a0;
  byte local_9e;
  short local_97;
  byte local_95;
  short local_94;
  byte local_92;
  short local_8e;
  ushort local_8c;
  ushort local_8a;
  short local_88;
  undefined1 local_86 [3];
  byte local_83;
  short local_82;
  ushort local_80;
  undefined4 local_7c;
  short local_73;
  byte local_71;
  ushort local_70;
  short local_6e;
  uint local_6c;
  undefined1 *local_68;
  ushort local_60;
  uint local_5e;
  ushort local_5a;
  short *local_58;
  short local_4c;
  byte local_4a;
  short local_45;
  byte local_43;
  ushort local_42;
  short local_3f;
  byte local_3d;
  short local_3c;
  byte local_3a;
  short local_36;
  ushort local_34;
  short local_32;
  short local_30;
  undefined1 local_2e [3];
  byte local_2b;
  short local_2a;
  ushort local_28;
  ushort local_26;
  undefined4 local_24;
  ushort local_1e;
  short local_1b;
  byte local_19;
  ushort local_18;
  short local_16;
  uint local_14;
  undefined1 *local_10;
  ushort local_6;
  uint local_4;
  
  local_db = in_DX != 1;
  local_c8 = &local_de;
  local_7c = 0;
  local_a8 = local_c8;
  if (in_DX == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
            "divider must be != 0");
    abort();
  }
  local_80 = in_DX;
  if ((short)in_DX < 0) {
    local_80 = -in_DX;
  }
  local_82 = 0xf - ((short)LZCOUNT((uint)local_80) + -0x10);
  local_71 = (byte)local_82;
  if ((local_80 & local_80 - 1) == 0) {
    local_73 = 0;
    bVar4 = 0;
    if ((short)in_DX < 0) {
      bVar4 = 0x80;
    }
    local_71 = local_71 | bVar4;
  }
  else {
    local_5e = (1 << (local_71 - 1 & 0x1f)) << 0x10;
    local_68 = local_86;
    local_6c = local_5e;
    local_6e = (short)(local_5e / local_80);
    sVar1 = local_6e * local_80;
    local_8a = local_80 + sVar1;
    if ((int)(uint)local_8a < 1 << (local_71 & 0x1f)) {
      local_83 = local_71 - 1;
      local_88 = local_6e;
    }
    else {
      local_88 = local_6e * 2;
      local_8c = sVar1 * -2;
      if ((local_80 <= local_8c) || (local_8c < (ushort)-sVar1)) {
        local_88 = local_88 + 1;
      }
      local_83 = local_71 | 0x40;
    }
    local_88 = local_88 + 1;
    local_8e = local_88;
    if ((short)in_DX < 0) {
      local_83 = local_83 | 0x80;
      local_8e = -local_88;
    }
    local_71 = local_83;
    local_73 = local_8e;
    local_60 = local_80;
  }
  local_92 = local_71;
  local_94 = local_73;
  local_95 = local_71;
  local_97 = local_73;
  local_9e = local_71;
  local_a0 = local_73;
  local_dc = local_71;
  local_de = local_73;
  local_ba = in_DX;
  if (!(bool)local_db) {
    local_ba = 2;
  }
  local_b8 = &local_e1;
  local_24 = 1;
  local_70 = local_80;
  local_5a = local_ba;
  local_58 = local_b8;
  local_42 = local_ba;
  local_1e = local_ba;
  if (local_ba == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
            "divider must be != 0");
    abort();
  }
  local_28 = local_ba;
  if ((short)local_ba < 0) {
    local_28 = -local_ba;
  }
  local_2a = 0xf - ((short)LZCOUNT((uint)local_28) + -0x10);
  local_19 = (byte)local_2a;
  if ((local_28 & local_28 - 1) == 0) {
    local_1b = 0;
    bVar4 = 0;
    if ((short)local_ba < 0) {
      bVar4 = 0x80;
    }
    local_19 = local_19 | bVar4;
  }
  else {
    local_4 = (1 << (local_19 - 1 & 0x1f)) << 0x10;
    local_10 = local_2e;
    local_14 = local_4;
    local_16 = (short)(local_4 / local_28);
    sVar1 = local_16 * local_28;
    local_32 = local_28 + sVar1;
    local_30 = local_16 * 2;
    local_34 = sVar1 * -2;
    if ((local_28 <= local_34) || (local_34 < (ushort)-sVar1)) {
      local_30 = local_30 + 1;
    }
    local_2b = local_19 | 0x40;
    local_36 = local_30 + 1;
    if ((short)local_ba < 0) {
      local_2b = local_19 | 0xc0;
    }
    local_19 = local_2b;
    local_30 = local_36;
    local_1b = local_36;
    local_6 = local_28;
  }
  local_3a = local_19;
  local_3c = local_1b;
  local_43 = local_19;
  local_45 = local_1b;
  local_3f = local_1b;
  local_3d = local_19;
  local_4a = local_19;
  local_4c = local_1b;
  local_df = local_19;
  local_e1 = local_1b;
  local_f0 = 0x7fffffffffffffff;
  local_f8 = 0x7fffffffffffffff;
  local_100 = 0x7fffffffffffffff;
  local_108 = 0x7fffffffffffffff;
  local_110 = 0x7fffffffffffffff;
  local_118 = 0x7fffffffffffffff;
  local_d8 = in_RSI;
  local_26 = local_ba;
  local_18 = local_28;
  for (local_130 = 0; auVar11 = in_ZMM1._0_16_, local_130 < 0x1e; local_130 = local_130 + 1) {
    local_140 = time_function<short,short>
                          (in_stack_fffffffffffffdf0,
                           (short)((ulong)in_stack_fffffffffffffde8 >> 0x30),
                           (pFuncToTime<short,_short>)in_stack_fffffffffffffde0);
    in_ZMM0 = ZEXT1664((undefined1  [16])local_140);
    local_128 = local_140;
    puVar3 = std::min<unsigned_long>(&local_110,&local_128.time);
    local_110 = *puVar3;
    local_148 = local_128.result;
    local_15a = local_dc;
    local_15c = local_de;
    local_15e = local_dc;
    local_160 = local_de;
    local_158 = time_function<short,libdivide::divider<short,(libdivide::Branching)0>>
                          (in_stack_fffffffffffffde8,
                           (dispatcher_t)SUB83((ulong)in_stack_fffffffffffffdf0 >> 0x28,0),
                           (pFuncToTime<short,_libdivide::divider<short>_>)in_stack_fffffffffffffde0
                          );
    local_128.time = local_158.time;
    local_128.result = local_158.result;
    puVar3 = std::min<unsigned_long>(&local_f0,&local_128.time);
    local_f0 = *puVar3;
    check_result(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
    if ((local_db & 1) != 0) {
      local_172 = local_df;
      local_174 = local_e1;
      local_176 = local_df;
      local_178 = local_e1;
      local_170 = time_function<short,libdivide::divider<short,(libdivide::Branching)1>>
                            (in_stack_fffffffffffffde8,
                             (dispatcher_t)SUB83((ulong)in_stack_fffffffffffffdf0 >> 0x28,0),
                             in_stack_fffffffffffffde0);
      local_128.time = local_170.time;
      local_128.result = local_170.result;
      puVar3 = std::min<unsigned_long>(&local_f8,&local_128.time);
      local_f8 = *puVar3;
      check_result(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
    }
    local_18a = local_dc;
    local_18c = local_de;
    local_18e = local_dc;
    local_190 = local_de;
    local_188 = time_function<short,libdivide::divider<short,(libdivide::Branching)0>>
                          (in_stack_fffffffffffffde8,
                           (dispatcher_t)SUB83((ulong)in_stack_fffffffffffffdf0 >> 0x28,0),
                           (pFuncToTime<short,_libdivide::divider<short>_>)in_stack_fffffffffffffde0
                          );
    local_128 = local_188;
    puVar3 = std::min<unsigned_long>(&local_100,&local_128.time);
    local_100 = *puVar3;
    check_result(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
    if ((local_db & 1) != 0) {
      local_1a2 = local_df;
      local_1a4 = local_e1;
      local_1a6 = local_df;
      local_1a8 = local_e1;
      local_1a0 = time_function<short,libdivide::divider<short,(libdivide::Branching)1>>
                            (in_stack_fffffffffffffde8,
                             (dispatcher_t)SUB83((ulong)in_stack_fffffffffffffdf0 >> 0x28,0),
                             in_stack_fffffffffffffde0);
      local_128 = local_1a0;
      puVar3 = std::min<unsigned_long>(&local_108,&local_128.time);
      local_108 = *puVar3;
      check_result(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
    }
    timer::timer(&local_1c8);
    timer::start((timer *)0x1069c5);
    generate_divisor<short>
              (in_stack_fffffffffffffdd0,(short)((ulong)in_stack_fffffffffffffdc8 >> 0x30));
    timer::stop((timer *)0x1069e7);
    local_1d0 = timer::duration_nano(&local_1c8);
    puVar3 = std::min<unsigned_long>(&local_118,&local_1d0);
    local_118 = *puVar3;
  }
  auVar6 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,local_118);
  dVar5 = auVar6._0_8_;
  uVar2 = random_numerators<short>::length(local_d8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,uVar2);
  auVar6._0_8_ = dVar5 / auVar11._0_8_;
  auVar6._8_8_ = 0;
  in_RDI->gen_time = auVar6._0_8_;
  auVar6 = vcvtusi2sd_avx512f(auVar6,local_f0);
  uVar2 = random_numerators<short>::length(local_d8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,uVar2);
  auVar7._0_8_ = auVar6._0_8_ / auVar11._0_8_;
  auVar7._8_8_ = 0;
  in_RDI->base_time = auVar7._0_8_;
  if ((local_db & 1) == 0) {
    dVar5 = -1.0;
  }
  else {
    auVar6 = vcvtusi2sd_avx512f(auVar7,local_f8);
    dVar5 = auVar6._0_8_;
    uVar2 = random_numerators<short>::length(local_d8);
    auVar11 = vcvtusi2sd_avx512f(auVar11,uVar2);
    dVar5 = dVar5 / auVar11._0_8_;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar5;
  in_RDI->branchfree_time = dVar5;
  auVar6 = vcvtusi2sd_avx512f(auVar8,local_100);
  uVar2 = random_numerators<short>::length(local_d8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,uVar2);
  auVar9._0_8_ = auVar6._0_8_ / auVar11._0_8_;
  auVar9._8_8_ = 0;
  in_RDI->vector_time = auVar9._0_8_;
  if ((local_db & 1) == 0) {
    dVar5 = -1.0;
  }
  else {
    auVar6 = vcvtusi2sd_avx512f(auVar9,local_108);
    dVar5 = auVar6._0_8_;
    uVar2 = random_numerators<short>::length(local_d8);
    auVar11 = vcvtusi2sd_avx512f(auVar11,uVar2);
    dVar5 = dVar5 / auVar11._0_8_;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  in_RDI->vector_branchfree_time = dVar5;
  auVar6 = vcvtusi2sd_avx512f(auVar10,local_110);
  dVar5 = auVar6._0_8_;
  uVar2 = random_numerators<short>::length(local_d8);
  auVar11 = vcvtusi2sd_avx512f(auVar11,uVar2);
  in_RDI->hardware_time = dVar5 / auVar11._0_8_;
  return in_RDI;
}

Assistant:

NOINLINE TestResult test_one(const random_numerators<IntT> &vals, IntT denom) {
    const bool testBranchfree = (denom != 1);
    divider<IntT, BRANCHFULL> div_bfull(denom);
    divider<IntT, BRANCHFREE> div_bfree(testBranchfree ? denom : 2);

    uint64_t min_my_time = INT64_MAX, min_my_time_branchfree = INT64_MAX,
             min_my_time_vector = INT64_MAX, min_my_time_vector_branchfree = INT64_MAX,
             min_his_time = INT64_MAX, min_gen_time = INT64_MAX;
    time_double tresult;
    for (size_t iter = 0; iter < TEST_COUNT; iter++) {
        tresult = time_function(vals, denom, sum_quotients);
        min_his_time = (std::min)(min_his_time, tresult.time);
        const uint64_t expected = tresult.result;

        tresult = time_function(vals, div_bfull, sum_quotients);
        min_my_time = (std::min)(min_my_time, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients);
            min_my_time_branchfree = (std::min)(min_my_time_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }

#if defined(x86_VECTOR_TYPE) || defined(LIBDIVIDE_NEON)
        tresult = time_function(vals, div_bfull, sum_quotients_vec);
        min_my_time_vector = (std::min)(min_my_time_vector, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients_vec);
            min_my_time_vector_branchfree = (std::min)(min_my_time_vector_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }
#else
        min_my_time_vector = 0;
        min_my_time_vector_branchfree = 0;
#endif

        {
            timer t;
            t.start();
            generate_divisor(vals, denom);
            t.stop();
            min_gen_time = (std::min)(min_gen_time, t.duration_nano());
        }
    }

    TestResult result;
    result.gen_time = min_gen_time / (double)vals.length();
    result.base_time = min_my_time / (double)vals.length();
    result.branchfree_time = testBranchfree ? min_my_time_branchfree / (double)vals.length() : -1;
    result.vector_time = min_my_time_vector / (double)vals.length();
    result.vector_branchfree_time =
        testBranchfree ? min_my_time_vector_branchfree / (double)vals.length() : -1;
    result.hardware_time = min_his_time / (double)vals.length();
    return result;
}